

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

ProcessorInstance * __thiscall
soul::ResolutionPass::ProcessorInstanceResolver::visit
          (ProcessorInstanceResolver *this,ProcessorInstance *instance)

{
  size_t *psVar1;
  Expression *pEVar2;
  UnqualifiedName *pUVar3;
  pointer ppVar4;
  pointer ppVar5;
  string *psVar6;
  pointer pcVar7;
  Allocator *pAVar8;
  string_view firstReplacement;
  UTF8Reader UVar9;
  bool bVar10;
  int iVar11;
  undefined4 extraout_var;
  Scope *pSVar12;
  Graph *g;
  long *plVar13;
  Namespace *pNVar14;
  ModuleBase *pMVar15;
  UTF8Reader this_00;
  ProcessorRef *pPVar16;
  long lVar17;
  size_type *psVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  Scope *s;
  string_view firstToReplace;
  pool_ref<soul::AST::ProcessorBase> target;
  pool_ptr<soul::AST::ProcessorBase> p;
  string nameRoot;
  function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  oldCloneFn;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> specialisationArgs;
  undefined8 in_stack_fffffffffffffd00;
  undefined8 uVar19;
  undefined8 local_2f8;
  undefined1 local_2f0 [16];
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> local_2e0;
  UTF8Reader local_2a8;
  string local_2a0;
  _Any_data local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  pointer local_240;
  pointer local_238;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> local_230;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  pool_ptr<soul::AST::Expression> local_138;
  IdentifierPath local_130;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  undefined4 extraout_var_00;
  
  RewritingASTVisitor::visit((RewritingASTVisitor *)this,instance);
  pEVar2 = (instance->targetProcessor).object;
  if (pEVar2 != (Expression *)0x0) {
    (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[6])(&local_2a8);
    UVar9.data = local_2a8.data;
    if ((ProcessorBase *)local_2a8.data != (ProcessorBase *)0x0) {
      if ((ProcessorInstance *)(((CodeLocation *)(local_2a8.data + 0x120))->sourceCode).object !=
          instance) {
        local_138.object = (instance->specialisationArgs).object;
        AST::CommaSeparatedList::getAsExpressionList(&local_230,&local_138);
        if ((ProcessorBase *)local_2a8.data == (ProcessorBase *)0x0) {
          throwInternalCompilerError("object != nullptr","operator*",0x3b);
        }
        this_00.data = local_2a8.data;
        bVar10 = ModuleInstanceResolver::validateSpecialisationArgs
                           (&this->super_ModuleInstanceResolver,&local_230,
                            (vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                             *)(local_2a8.data + 0x50),
                            (this->super_ModuleInstanceResolver).
                            super_ErrorIgnoringRewritingASTVisitor.ignoreErrors);
        if (bVar10) {
          pSVar12 = (instance->super_ASTObject).context.parentScope;
          bVar10 = false;
          do {
            iVar11 = (*pSVar12->_vptr_Scope[6])(pSVar12);
            lVar17 = CONCAT44(extraout_var,iVar11);
            if (lVar17 != 0) {
              if (!bVar10) goto LAB_00218ff8;
              break;
            }
            iVar11 = (*pSVar12->_vptr_Scope[4])(pSVar12);
            pSVar12 = (Scope *)CONCAT44(extraout_var_00,iVar11);
            bVar10 = pSVar12 == (Scope *)0x0;
          } while (!bVar10);
          lVar17 = 0;
LAB_00218ff8:
          if (lVar17 == 0) {
            g = (Graph *)0x0;
          }
          else {
            g = (Graph *)__dynamic_cast(lVar17,&AST::ProcessorBase::typeinfo,&AST::Graph::typeinfo,0
                                       );
          }
          if (g == (Graph *)0x0) {
            throwInternalCompilerError("object != nullptr","operator*",0x3b);
          }
          SanityCheckPass::RecursiveGraphDetector::check(g,(RecursiveGraphDetector *)0x0);
          uVar19 = in_stack_fffffffffffffd00;
          if ((instance->implicitInstanceSource).object == (SharedEndpoint *)0x0) {
            pUVar3 = (instance->instanceName).object;
            if (pUVar3 == (UnqualifiedName *)0x0) {
              throwInternalCompilerError("object != nullptr","operator->",0x3c);
            }
            IdentifierPath::IdentifierPath(&local_130,(pUVar3->identifier).name);
            AST::Scope::getMatchingSubModules
                      ((vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                        *)&stack0xfffffffffffffd00,
                       &(g->super_ProcessorBase).super_ModuleBase.super_Scope,&local_130);
            uVar19 = in_stack_fffffffffffffd00;
            if ((Identifier *)in_stack_fffffffffffffd00 != (Identifier *)0x0) {
              operator_delete((void *)in_stack_fffffffffffffd00,
                              local_2f0._0_8_ - in_stack_fffffffffffffd00);
            }
            local_130.pathSections.numActive = 0;
            if (8 < local_130.pathSections.numAllocated) {
              if (local_130.pathSections.items != (Identifier *)0x0) {
                operator_delete__(local_130.pathSections.items);
              }
              local_130.pathSections.items = (Identifier *)local_130.pathSections.space;
              local_130.pathSections.numAllocated = 8;
            }
            if (in_stack_fffffffffffffd00 != local_2f8) {
              AST::ProcessorInstance::getReadableName_abi_cxx11_
                        ((string *)&stack0xfffffffffffffd00,instance);
              CompileMessageHelpers::createMessage<std::__cxx11::string>
                        (&local_d8,(CompileMessageHelpers *)0x1,none,0x2ac9ea,
                         &stack0xfffffffffffffd00,in_R9);
              AST::Context::throwError(&(instance->super_ASTObject).context,&local_d8,false);
            }
          }
          bVar10 = ModuleInstanceResolver::canResolveAllSpecialisationArgs
                             (&this->super_ModuleInstanceResolver,&local_230,
                              &(((ProcessorBase *)this_00.data)->super_ModuleBase).
                               specialisationParams);
          lVar17 = 0x28;
          if (bVar10) {
            ppVar4 = (((ProcessorBase *)this_00.data)->super_ModuleBase).specialisationParams.
                     super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ppVar5 = (((ProcessorBase *)this_00.data)->super_ModuleBase).specialisationParams.
                     super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if ((ppVar4 != ppVar5) ||
               ((((ProcessorBase *)this_00.data)->owningInstance).object != (ProcessorInstance *)0x0
               )) {
              psVar6 = (((ProcessorBase *)this_00.data)->super_ModuleBase).name.name;
              if (psVar6 == (string *)0x0) {
                throwInternalCompilerError("isValid()","toString",0x23);
              }
              local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
              pcVar7 = (psVar6->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2a0,pcVar7,pcVar7 + psVar6->_M_string_length);
              local_238 = ppVar5;
              if (ppVar4 != ppVar5) {
                (*(g->super_ProcessorBase).super_ModuleBase.super_ASTObject._vptr_ASTObject[0xd])
                          (&stack0xfffffffffffffd00,g);
                IdentifierPath::toString_abi_cxx11_
                          (&local_1d8,(IdentifierPath *)&stack0xfffffffffffffd00);
                firstReplacement._M_str = (char *)uVar19;
                firstReplacement._M_len = (size_t)this_00.data;
                firstToReplace._M_str = (char *)0x1;
                firstToReplace._M_len = (size_t)":";
                choc::text::replace<std::__cxx11::string>
                          (&local_1b8,(text *)&local_1d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1,
                           firstToReplace,firstReplacement);
                plVar13 = (long *)std::__cxx11::string::append((char *)&local_1b8);
                psVar18 = (size_type *)(plVar13 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar13 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar18) {
                  local_260.field_2._M_allocated_capacity = *psVar18;
                  local_260.field_2._8_8_ = plVar13[3];
                  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
                }
                else {
                  local_260.field_2._M_allocated_capacity = *psVar18;
                  local_260._M_dataplus._M_p = (pointer)*plVar13;
                }
                local_260._M_string_length = plVar13[1];
                *plVar13 = (long)psVar18;
                plVar13[1] = 0;
                *(undefined1 *)(plVar13 + 2) = 0;
                pUVar3 = (instance->instanceName).object;
                if (pUVar3 == (UnqualifiedName *)0x0) {
                  throwInternalCompilerError("object != nullptr","operator->",0x3c);
                }
                AST::UnqualifiedName::toString_abi_cxx11_(&local_1f8,pUVar3);
                std::operator+(&local_198,&local_260,&local_1f8);
                makeSafeIdentifierName(&local_178,&local_198);
                std::operator+(&local_158,"_for_",&local_178);
                TokenisedPathString::join((string *)&local_280,&local_2a0,&local_158);
                std::__cxx11::string::operator=
                          ((string *)&local_2a0,(string *)local_280._M_pod_data);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_280._M_unused._0_8_ != &local_270) {
                  operator_delete(local_280._M_unused._M_object,
                                  (ulong)(local_270._M_allocated_capacity + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158._M_dataplus._M_p != &local_158.field_2) {
                  operator_delete(local_158._M_dataplus._M_p,
                                  local_158.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_178._M_dataplus._M_p != &local_178.field_2) {
                  operator_delete(local_178._M_dataplus._M_p,
                                  local_178.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_dataplus._M_p != &local_198.field_2) {
                  operator_delete(local_198._M_dataplus._M_p,
                                  local_198.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  local_1f8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_260._M_dataplus._M_p != &local_260.field_2) {
                  operator_delete(local_260._M_dataplus._M_p,
                                  local_260.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                  operator_delete(local_1b8._M_dataplus._M_p,
                                  local_1b8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                  operator_delete(local_1d8._M_dataplus._M_p,
                                  local_1d8.field_2._M_allocated_capacity + 1);
                }
                if ((pointer)0x8 < (ulong)local_2f0._0_8_) {
                  if ((Identifier *)uVar19 != (Identifier *)0x0) {
                    operator_delete__((void *)uVar19);
                  }
                  uVar19 = local_2f0 + 8;
                  local_2f0._0_8_ = (pointer)0x8;
                }
              }
              local_240 = ppVar4;
              pNVar14 = AST::ModuleBase::getNamespace((ModuleBase *)this_00.data);
              pAVar8 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                       allocator;
              AST::Scope::makeUniqueName
                        ((string *)&stack0xfffffffffffffd00,&(pNVar14->super_ModuleBase).super_Scope
                         ,&local_2a0);
              if ((((ProcessorBase *)this_00.data)->super_ModuleBase).createClone.
                  super__Function_base._M_manager == (_Manager_type)0x0) {
                std::__throw_bad_function_call();
              }
              pMVar15 = (*(((ProcessorBase *)this_00.data)->super_ModuleBase).createClone._M_invoker
                        )((_Any_data *)
                          &(((ProcessorBase *)this_00.data)->super_ModuleBase).createClone,pAVar8,
                          pNVar14,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&stack0xfffffffffffffd00);
              this_00.data = (char *)__dynamic_cast(pMVar15,&AST::ModuleBase::typeinfo,
                                                    &AST::ProcessorBase::typeinfo,0);
              ppVar5 = local_238;
              ppVar4 = local_240;
              if ((ProcessorBase *)this_00.data == (ProcessorBase *)0x0) {
                throwInternalCompilerError("object != nullptr","operator*",0x3b);
              }
              if ((Identifier *)uVar19 != (Identifier *)local_2f0) {
                operator_delete((void *)uVar19,(ulong)(local_2f0._0_8_ + 1));
              }
              if (ppVar4 != ppVar5) {
                std::
                function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::function((function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)&local_280,
                           &(((ProcessorBase *)this_00.data)->super_ModuleBase).createClone);
                std::
                function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::function((function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)&stack0xfffffffffffffd00,
                           (function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)&local_280);
                ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::
                ArrayWithPreallocation(&local_2e0,&local_230);
                std::
                function<soul::AST::ModuleBase&(soul::AST::Allocator&,soul::AST::Namespace&,std::__cxx11::string_const&)>
                ::operator=((function<soul::AST::ModuleBase&(soul::AST::Allocator&,soul::AST::Namespace&,std::__cxx11::string_const&)>
                             *)&(((ProcessorBase *)this_00.data)->super_ModuleBase).createClone,
                            (anon_class_88_2_5590cdb4 *)&stack0xfffffffffffffd00);
                visit(soul::AST::ProcessorInstance&)::
                {lambda(soul::AST::Allocator&,soul::AST::Namespace&,std::__cxx11::string_const&)#1}
                ::~basic_string((_lambda_soul__AST__Allocator__soul__AST__Namespace__std____cxx11__string_const___1_
                                 *)&stack0xfffffffffffffd00);
                ModuleInstanceResolver::resolveAllSpecialisationArgs
                          (&local_230,
                           &(((ProcessorBase *)this_00.data)->super_ModuleBase).specialisationParams
                          );
                if ((code *)local_270._M_allocated_capacity != (code *)0x0) {
                  (*(code *)local_270._M_allocated_capacity)(&local_280,&local_280,3);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                operator_delete(local_2a0._M_dataplus._M_p,
                                local_2a0.field_2._M_allocated_capacity + 1);
              }
            }
            (((ProcessorBase *)this_00.data)->owningInstance).object = instance;
            (((ProcessorBase *)this_00.data)->originalBeforeSpecialisation).object =
                 (ProcessorBase *)local_2a8.data;
            pPVar16 = PoolAllocator::
                      allocate<soul::AST::ProcessorRef,soul::AST::Context&,soul::pool_ref<soul::AST::ProcessorBase>&>
                                (&((this->super_ModuleInstanceResolver).
                                   super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,
                                 &(instance->super_ASTObject).context,
                                 (pool_ref<soul::AST::ProcessorBase> *)&stack0xfffffffffffffcf8);
            (instance->targetProcessor).object = &pPVar16->super_Expression;
            (instance->specialisationArgs).object = (Expression *)0x0;
            lVar17 = 8;
          }
        }
        else {
          lVar17 = 0x28;
          if ((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
              ignoreErrors == false) {
            (*(((ProcessorBase *)this_00.data)->super_ModuleBase).super_ASTObject._vptr_ASTObject
              [0xe])(&stack0xfffffffffffffd00);
            CompileMessageHelpers::createMessage<soul::IdentifierPath>
                      (&local_a0,syntax,error,
                       "Wrong number of arguments to instantiate namespace $Q0$",
                       (IdentifierPath *)&stack0xfffffffffffffd00);
            AST::Context::throwError(&(instance->super_ASTObject).context,&local_a0,false);
          }
        }
        plVar13 = (long *)((long)&(this->super_ModuleInstanceResolver).
                                  super_ErrorIgnoringRewritingASTVisitor.super_RewritingASTVisitor.
                                  _vptr_RewritingASTVisitor + lVar17);
        *plVar13 = *plVar13 + 1;
        local_230.numActive = 0;
        if (4 < local_230.numAllocated) {
          if (local_230.items != (pool_ref<soul::AST::Expression> *)0x0) {
            operator_delete__(local_230.items);
          }
          local_230.items = (pool_ref<soul::AST::Expression> *)local_230.space;
          local_230.numAllocated = 4;
        }
      }
      if ((ProcessorBase *)UVar9.data != (ProcessorBase *)0x0) {
        return instance;
      }
    }
    if ((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.ignoreErrors !=
        false) {
      psVar1 = &(this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.numFails
      ;
      *psVar1 = *psVar1 + 1;
      return instance;
    }
    pEVar2 = (instance->targetProcessor).object;
    if (pEVar2 != (Expression *)0x0) {
      CompileMessageHelpers::createMessage<>(&local_68,syntax,error,"Expected a processor name");
      AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_68,false);
    }
  }
  throwInternalCompilerError("object != nullptr","operator->",0x3c);
}

Assistant:

AST::ProcessorInstance& visit (AST::ProcessorInstance& instance) override
        {
            super::visit (instance);

            if (auto p = instance.targetProcessor->getAsProcessor())
            {
                if (p->owningInstance == instance)
                    return instance;

                auto specialisationArgs = AST::CommaSeparatedList::getAsExpressionList (instance.specialisationArgs);
                auto target = pool_ref<AST::ProcessorBase> (*p);

                if (! validateSpecialisationArgs (specialisationArgs, target->specialisationParams, ignoreErrors))
                {
                    if (ignoreErrors)
                    {
                        ++numFails;
                        return instance;
                    }

                    instance.context.throwError (Errors::wrongNumArgsForNamespace (target->getFullyQualifiedDisplayPath()));
                }

                auto& graph = *cast<AST::Graph> (instance.getParentScope()->findProcessor());
                SanityCheckPass::RecursiveGraphDetector::check (graph);

                if (! instance.isImplicitlyCreated())
                    if (! graph.getMatchingSubModules (instance.instanceName->getIdentifierPath()).empty())
                        instance.context.throwError (Errors::alreadyProcessorWithName (instance.getReadableName()));

                if (! canResolveAllSpecialisationArgs (specialisationArgs, target->specialisationParams))
                {
                    ++numFails;
                    return instance;
                }

                bool requiresSpecialisation = ! target->specialisationParams.empty();

                if (target->owningInstance != nullptr || requiresSpecialisation)
                {
                    auto nameRoot = target->name.toString();

                    if (requiresSpecialisation)
                        nameRoot = TokenisedPathString::join (nameRoot,
                                                              "_for_" + makeSafeIdentifierName (choc::text::replace (graph.getFullyQualifiedPath().toString(), ":", "_")
                                                                  + "_" + instance.instanceName->toString()));
                    auto& ns = target->getNamespace();
                    target = *cast<AST::ProcessorBase> (target->createClone (allocator, ns, ns.makeUniqueName (nameRoot)));

                    if (requiresSpecialisation)
                    {
                        auto oldCloneFn = target->createClone;

                        target->createClone = [=] (AST::Allocator& a, AST::Namespace& parentNS, const std::string& newName) -> AST::ModuleBase&
                        {
                            auto& m = oldCloneFn (a, parentNS, newName);
                            resolveAllSpecialisationArgs (specialisationArgs, m.specialisationParams);
                            return m;
                        };

                        resolveAllSpecialisationArgs (specialisationArgs, target->specialisationParams);
                    }
                }

                target->owningInstance = instance;
                target->originalBeforeSpecialisation = p;
                instance.targetProcessor = allocator.allocate<AST::ProcessorRef> (instance.context, target);
                instance.specialisationArgs = nullptr;
                ++itemsReplaced;
                return instance;
            }

            if (! ignoreErrors)
                instance.targetProcessor->context.throwError (Errors::expectedProcessorName());

            ++numFails;
            return instance;
        }